

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

Dim * __thiscall
cnn::AddVectorToAllColumns::dim_forward
          (AddVectorToAllColumns *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *this_00;
  invalid_argument *this_01;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  Dim *os;
  
  os = in_RDI;
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 == 2) {
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    in_stack_ffffffffffffffcc = Dim::rows(pvVar3);
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
    uVar1 = Dim::rows(pvVar3);
    if (in_stack_ffffffffffffffcc == uVar1) {
      pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      uVar1 = Dim::ndims(pvVar3);
      if (uVar1 == 2) {
        pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,1);
        uVar1 = Dim::ndims(pvVar3);
        if (uVar1 == 1) {
          pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
          memcpy(os,pvVar3,0x24);
          return in_RDI;
        }
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad input dimensions in AddVectorToAllColumns: ");
  this_00 = cnn::operator<<((ostream *)os,
                            (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"bad input dimensions in AddVectorToAllColumns");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim AddVectorToAllColumns::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 || xs[0].rows() != xs[1].rows() || xs[0].ndims() != 2 || xs[1].ndims() != 1) {
    cerr << "Bad input dimensions in AddVectorToAllColumns: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in AddVectorToAllColumns");
  }
  return xs[0];
}